

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

void xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,
                       xmlRelaxNGDefinePtr_conflict parent)

{
  uint uVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  int iVar3;
  xmlRelaxNGType xVar4;
  xmlRelaxNGParserCtxtPtr pxVar5;
  xmlRelaxNGParserCtxtPtr pxVar6;
  xmlRelaxNGParserCtxtPtr in_RCX;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  xmlRelaxNGParserCtxtPtr parent_00;
  
  if (cur != (xmlRelaxNGDefinePtr_conflict)0x0) {
    parent_00 = (xmlRelaxNGParserCtxtPtr)0x0;
    do {
      xVar4 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
      pxVar6 = (xmlRelaxNGParserCtxtPtr)cur;
      if (xVar4 < XML_RELAXNG_REF) {
        if (xVar4 == XML_RELAXNG_EMPTY) {
          ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
          if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
            uVar1 = parent->type + ~XML_RELAXNG_OPTIONAL;
            in_RCX = (xmlRelaxNGParserCtxtPtr)(ulong)uVar1;
            if (1 < uVar1) {
              if ((parent->type & ~XML_RELAXNG_NOT_ALLOWED) != XML_RELAXNG_GROUP) goto LAB_00187393;
              goto LAB_00187386;
            }
LAB_001873a9:
            xVar4 = XML_RELAXNG_EMPTY;
LAB_001873ab:
            parent->type = xVar4;
            return;
          }
        }
        else {
          if (xVar4 != XML_RELAXNG_NOT_ALLOWED) goto LAB_001871bc;
          ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
          if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) ||
             (xVar4 = parent->type, 0x13 < (uint)xVar4)) goto LAB_00187393;
          if (xVar4 == XML_RELAXNG_CHOICE) goto LAB_00187386;
LAB_00187175:
          in_RCX = (xmlRelaxNGParserCtxtPtr)&DAT_000d8300;
          cur = (xmlRelaxNGDefinePtr_conflict)pxVar6;
          if ((0xd8300U >> (xVar4 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) != 0) {
            xVar4 = XML_RELAXNG_NOT_ALLOWED;
            goto LAB_001873ab;
          }
        }
      }
      else {
        if ((xVar4 == XML_RELAXNG_PARENTREF) || (xVar4 == XML_RELAXNG_REF)) {
          pxVar6 = parent_00;
          if ((short)((xmlRelaxNGParserCtxtPtr)cur)->nbInterleaves != -3) {
            *(short *)&((xmlRelaxNGParserCtxtPtr)cur)->nbInterleaves = -3;
            xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                    ((xmlRelaxNGParserCtxtPtr)cur)->grammar,cur);
          }
          goto LAB_00187393;
        }
LAB_001871bc:
        ((xmlRelaxNGParserCtxtPtr)cur)->parentgrammar = (xmlRelaxNGGrammarPtr_conflict)parent;
        if ((xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar !=
            (xmlRelaxNGDefinePtr_conflict)0x0) {
          xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                  ((xmlRelaxNGParserCtxtPtr)cur)->grammar,cur);
          xVar4 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
        }
        if ((xVar4 != XML_RELAXNG_VALUE) &&
           (*(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings !=
            (xmlRelaxNGDefinePtr_conflict)0x0)) {
          xmlRelaxNGSimplify(ctxt,*(xmlRelaxNGDefinePtr_conflict *)
                                   &((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings,cur);
        }
        if ((xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->define !=
            (xmlRelaxNGDefinePtr_conflict)0x0) {
          xmlRelaxNGSimplify(ctxt,(xmlRelaxNGDefinePtr_conflict)
                                  ((xmlRelaxNGParserCtxtPtr)cur)->define,cur);
        }
        if (*(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData == XML_RELAXNG_ELEMENT) {
          pxVar7 = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
          while (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
            iVar3 = xmlRelaxNGGenerateAttributes
                              ((xmlRelaxNGParserCtxtPtr)(ulong)(uint)ctxt->nbErrors,pxVar7);
            pxVar2 = (xmlRelaxNGDefinePtr_conflict)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
            if (iVar3 != 1) {
              if (pxVar2 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                for (pxVar7 = pxVar2->next; pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0;
                    pxVar7 = pxVar7->next) {
                  iVar3 = xmlRelaxNGGenerateAttributes
                                    ((xmlRelaxNGParserCtxtPtr)(ulong)(uint)ctxt->nbErrors,pxVar7);
                  if (iVar3 == 1) {
                    pxVar2->next = pxVar7->next;
                    pxVar7->next = *(xmlRelaxNGDefinePtr *)
                                    &((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings;
                    *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings =
                         pxVar7;
                    pxVar7 = pxVar2;
                  }
                  pxVar2 = pxVar7;
                }
              }
              break;
            }
            pxVar7 = pxVar2->next;
            ((xmlRelaxNGParserCtxtPtr)cur)->grammar = (xmlRelaxNGGrammarPtr_conflict)pxVar7;
            pxVar2->next = *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings;
            *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->nbWarnings = pxVar2;
          }
        }
        xVar4 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
        in_RCX = (xmlRelaxNGParserCtxtPtr)(ulong)(uint)(xVar4 & ~XML_RELAXNG_NOT_ALLOWED);
        if ((xVar4 & ~XML_RELAXNG_NOT_ALLOWED) == XML_RELAXNG_GROUP) {
          pxVar5 = (xmlRelaxNGParserCtxtPtr)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
          if (pxVar5 != (xmlRelaxNGParserCtxtPtr)0x0) {
            if (*(xmlRelaxNGDefinePtr *)&pxVar5->flags == (xmlRelaxNGDefinePtr)0x0) {
              if (parent == (xmlRelaxNGDefinePtr_conflict)0x0 &&
                  parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
                *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData = XML_RELAXNG_NOOP;
                in_RCX = (xmlRelaxNGParserCtxtPtr)0x0;
                goto LAB_00187393;
              }
              if (parent_00 == (xmlRelaxNGParserCtxtPtr)0x0) {
                parent->content = (xmlRelaxNGDefinePtr)pxVar5;
                in_RCX = (xmlRelaxNGParserCtxtPtr)((xmlRelaxNGParserCtxtPtr)cur)->grammar;
                pxVar5 = *(xmlRelaxNGParserCtxtPtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
                cur = (xmlRelaxNGDefinePtr_conflict)in_RCX;
              }
              else {
                *(xmlRelaxNGDefinePtr *)&pxVar5->flags =
                     *(xmlRelaxNGDefinePtr *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
                in_RCX = parent_00;
                cur = (xmlRelaxNGDefinePtr_conflict)pxVar5;
              }
              *(xmlRelaxNGParserCtxtPtr *)&in_RCX->flags = pxVar5;
            }
            xVar4 = *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData;
            pxVar6 = (xmlRelaxNGParserCtxtPtr)cur;
            goto LAB_00187334;
          }
          *(xmlRelaxNGType *)&((xmlRelaxNGParserCtxtPtr)cur)->userData = XML_RELAXNG_EMPTY;
LAB_00187352:
          cur = (xmlRelaxNGDefinePtr_conflict)pxVar6;
          if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
            uVar1 = parent->type + ~XML_RELAXNG_OPTIONAL;
            in_RCX = (xmlRelaxNGParserCtxtPtr)(ulong)uVar1;
            if (uVar1 < 2) goto LAB_001873a9;
            if ((uint)(parent->type + ~XML_RELAXNG_ONEORMORE) < 3) goto LAB_00187386;
          }
        }
        else {
LAB_00187334:
          if (xVar4 == XML_RELAXNG_EMPTY) goto LAB_00187352;
          cur = (xmlRelaxNGDefinePtr_conflict)pxVar6;
          if (xVar4 != XML_RELAXNG_NOT_ALLOWED) {
            if (((xVar4 == XML_RELAXNG_EXCEPT) &&
                ((xmlRelaxNGDefinePtr)pxVar6->grammar != (xmlRelaxNGDefinePtr)0x0)) &&
               (((xmlRelaxNGDefinePtr)pxVar6->grammar)->type == XML_RELAXNG_NOT_ALLOWED))
            goto LAB_00187386;
            goto LAB_00187393;
          }
          if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) ||
             (xVar4 = parent->type, 0x13 < (uint)xVar4)) goto LAB_00187393;
          if (xVar4 != XML_RELAXNG_CHOICE) goto LAB_00187175;
LAB_00187386:
          pxVar6 = (xmlRelaxNGParserCtxtPtr)
                   xmlRelaxNGTryUnlink((xmlRelaxNGParserCtxtPtr)cur,parent,
                                       (xmlRelaxNGDefinePtr_conflict)parent_00,
                                       (xmlRelaxNGDefinePtr_conflict)in_RCX);
        }
      }
LAB_00187393:
      cur = *(xmlRelaxNGDefinePtr_conflict *)&((xmlRelaxNGParserCtxtPtr)cur)->flags;
      parent_00 = pxVar6;
    } while ((xmlRelaxNGParserCtxtPtr)cur != (xmlRelaxNGParserCtxtPtr)0x0);
  }
  return;
}

Assistant:

static void
xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,
                   xmlRelaxNGDefinePtr cur, xmlRelaxNGDefinePtr parent)
{
    xmlRelaxNGDefinePtr prev = NULL;

    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_PARENTREF)) {
            if (cur->depth != -3) {
                cur->depth = -3;
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            }
        } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                 (parent->type == XML_RELAXNG_LIST) ||
                 (parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE) ||
                 (parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_NOT_ALLOWED;
                break;
            }
            if ((parent != NULL) && (parent->type == XML_RELAXNG_CHOICE)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else if (cur->type == XML_RELAXNG_EMPTY) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_EMPTY;
                break;
            }
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE))) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else {
            cur->parent = parent;
            if (cur->content != NULL)
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            if ((cur->type != XML_RELAXNG_VALUE) && (cur->attrs != NULL))
                xmlRelaxNGSimplify(ctxt, cur->attrs, cur);
            if (cur->nameClass != NULL)
                xmlRelaxNGSimplify(ctxt, cur->nameClass, cur);
            /*
             * On Elements, try to move attribute only generating rules on
             * the attrs rules.
             */
            if (cur->type == XML_RELAXNG_ELEMENT) {
                int attronly;
                xmlRelaxNGDefinePtr tmp, pre;

                while (cur->content != NULL) {
                    attronly =
                        xmlRelaxNGGenerateAttributes(ctxt, cur->content);
                    if (attronly == 1) {
                        /*
                         * migrate cur->content to attrs
                         */
                        tmp = cur->content;
                        cur->content = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        /*
                         * cur->content can generate elements or text
                         */
                        break;
                    }
                }
                pre = cur->content;
                while ((pre != NULL) && (pre->next != NULL)) {
                    tmp = pre->next;
                    attronly = xmlRelaxNGGenerateAttributes(ctxt, tmp);
                    if (attronly == 1) {
                        /*
                         * migrate tmp to attrs
                         */
                        pre->next = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        pre = tmp;
                    }
                }
            }
            /*
             * This may result in a simplification
             */
            if ((cur->type == XML_RELAXNG_GROUP) ||
                (cur->type == XML_RELAXNG_INTERLEAVE)) {
                if (cur->content == NULL)
                    cur->type = XML_RELAXNG_EMPTY;
                else if (cur->content->next == NULL) {
                    if ((parent == NULL) && (prev == NULL)) {
                        cur->type = XML_RELAXNG_NOOP;
                    } else if (prev == NULL) {
                        parent->content = cur->content;
                        cur->content->next = cur->next;
                        cur = cur->content;
                    } else {
                        cur->content->next = cur->next;
                        prev->next = cur->content;
                        cur = cur->content;
                    }
                }
            }
            /*
             * the current node may have been transformed back
             */
            if ((cur->type == XML_RELAXNG_EXCEPT) &&
                (cur->content != NULL) &&
                (cur->content->type == XML_RELAXNG_NOT_ALLOWED)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                     (parent->type == XML_RELAXNG_LIST) ||
                     (parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_NOT_ALLOWED;
                    break;
                }
                if ((parent != NULL) &&
                    (parent->type == XML_RELAXNG_CHOICE)) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else if (cur->type == XML_RELAXNG_EMPTY) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_EMPTY;
                    break;
                }
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_CHOICE))) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else {
                prev = cur;
            }
        }
        cur = cur->next;
    }
}